

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::AddIncludeDirectories
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *incs,bool before)

{
  bool bVar1;
  cmTarget *this_00;
  cmListFileBacktrace local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1d8;
  cmTarget *local_1a8;
  cmTarget *t;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
  *target;
  iterator __end1;
  iterator __begin1;
  cmTargetMap *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_150;
  cmStateDirectory local_120;
  cmListFileBacktrace local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_c8;
  cmStateDirectory local_88;
  string_view local_60;
  string_view local_50;
  undefined1 local_40 [8];
  string entryString;
  bool before_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *incs_local;
  cmMakefile *this_local;
  
  entryString.field_2._M_local_buf[0xf] = before;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(incs);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,";");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60);
    cmJoin((string *)local_40,incs,local_50,local_60);
    if ((entryString.field_2._M_local_buf[0xf] & 1U) == 0) {
      cmStateSnapshot::GetDirectory(&local_120,&this->StateSnapshot);
      std::__cxx11::string::string((string *)&local_170,(string *)local_40);
      cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&__range1,&this->Backtrace);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (&local_150,&local_170,(cmListFileBacktrace *)&__range1);
      cmStateDirectory::AppendIncludeDirectoriesEntry(&local_120,&local_150);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                (&local_150);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&__range1);
      std::__cxx11::string::~string((string *)&local_170);
    }
    else {
      cmStateSnapshot::GetDirectory(&local_88,&this->StateSnapshot);
      std::__cxx11::string::string((string *)&local_e8,(string *)local_40);
      cmListFileBacktrace::cmListFileBacktrace(&local_f8,&this->Backtrace);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (&local_c8,&local_e8,&local_f8);
      cmStateDirectory::PrependIncludeDirectoriesEntry(&local_88,&local_c8);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                (&local_c8);
      cmListFileBacktrace::~cmListFileBacktrace(&local_f8);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    __end1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
             ::begin(&this->Targets);
    target = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
              *)std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                ::end(&this->Targets);
    while (bVar1 = std::__detail::operator!=
                             (&__end1.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                              ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                                *)&target), bVar1) {
      t = (cmTarget *)
          std::__detail::
          _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
          ::operator*(&__end1);
      this_00 = &((reference)t)->second;
      local_1a8 = this_00;
      std::__cxx11::string::string((string *)&local_1f8,(string *)local_40);
      cmListFileBacktrace::cmListFileBacktrace(&local_208,&this->Backtrace);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (&local_1d8,&local_1f8,&local_208);
      cmTarget::InsertInclude(this_00,&local_1d8,(bool)(entryString.field_2._M_local_buf[0xf] & 1));
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                (&local_1d8);
      cmListFileBacktrace::~cmListFileBacktrace(&local_208);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
      ::operator++(&__end1);
    }
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void cmMakefile::AddIncludeDirectories(const std::vector<std::string>& incs,
                                       bool before)
{
  if (incs.empty()) {
    return;
  }

  std::string entryString = cmJoin(incs, ";");
  if (before) {
    this->StateSnapshot.GetDirectory().PrependIncludeDirectoriesEntry(
      BT<std::string>(entryString, this->Backtrace));
  } else {
    this->StateSnapshot.GetDirectory().AppendIncludeDirectoriesEntry(
      BT<std::string>(entryString, this->Backtrace));
  }

  // Property on each target:
  for (auto& target : this->Targets) {
    cmTarget& t = target.second;
    t.InsertInclude(BT<std::string>(entryString, this->Backtrace), before);
  }
}